

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playGround.cpp
# Opt level: O3

vector<sensor,_std::allocator<sensor>_> * __thiscall
PlayGround::execute(vector<sensor,_std::allocator<sensor>_> *__return_storage_ptr__,PlayGround *this
                   )

{
  pointer *ppsVar1;
  pair<int,_int> *ppVar2;
  pointer pvVar3;
  long lVar4;
  iterator iVar5;
  sensor *this_00;
  pointer psVar6;
  bool bVar7;
  pair<int,_int> pVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  sensor s;
  Room room;
  sensor local_44;
  undefined1 local_38 [24];
  
  if ((this->action).move == true) {
    pVar8 = playableWorld::move_forward(&this->playableworld);
  }
  else {
    pVar8 = (this->playableworld).agent_location;
  }
  if ((this->action).shoot == true) {
    playableWorld::shoot(&this->playableworld);
  }
  kill_agent(this);
  uVar11 = (long)pVar8 + -0x100000000 >> 0x20;
  pvVar3 = (this->playableworld).world.boxes.
           super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = ((long)(this->playableworld).world.boxes.
                  super__Vector_base<std::vector<Room,_std::allocator<Room>_>,_std::allocator<std::vector<Room,_std::allocator<Room>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
           -0x5555555555555555;
  if (uVar11 <= uVar10 && uVar10 - uVar11 != 0) {
    uVar10 = ((long)pVar8 << 0x20) + -0x100000000 >> 0x20;
    lVar4 = *(long *)&pvVar3[uVar11].super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                      super__Vector_impl_data;
    if (uVar10 < (ulong)((long)*(pointer *)
                                ((long)&pvVar3[uVar11].
                                        super__Vector_base<Room,_std::allocator<Room>_>._M_impl.
                                        super__Vector_impl_data + 8) - lVar4 >> 4)) {
      ppVar2 = (pair<int,_int> *)(lVar4 + uVar10 * 0x10);
      local_38._0_8_ = *ppVar2;
      local_38._8_8_ = ppVar2[1];
      (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar7 = Room::get_breeze((Room *)local_38);
      if (bVar7) {
        sensor::sensor(&local_44,pVar8,B);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)__return_storage_ptr__,iVar5,&local_44
                    );
        }
        else {
          (iVar5._M_current)->sense = local_44.sense;
          (iVar5._M_current)->location = local_44.location;
          ppsVar1 = &(__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
        (this->p).breeze = true;
      }
      bVar7 = Room::get_stench((Room *)local_38);
      if (bVar7) {
        sensor::sensor(&local_44,pVar8,S);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)__return_storage_ptr__,iVar5,&local_44
                    );
        }
        else {
          (iVar5._M_current)->sense = local_44.sense;
          (iVar5._M_current)->location = local_44.location;
          ppsVar1 = &(__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
        (this->p).stench = true;
      }
      bVar7 = Room::get_glitter((Room *)local_38);
      if (bVar7) {
        sensor::sensor(&local_44,pVar8,G);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)__return_storage_ptr__,iVar5,&local_44
                    );
        }
        else {
          (iVar5._M_current)->sense = local_44.sense;
          (iVar5._M_current)->location = local_44.location;
          ppsVar1 = &(__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
        this->is_gold_found = true;
        (this->p).glitter = true;
      }
      bVar7 = Room::has_pit((Room *)local_38);
      if (bVar7) {
        sensor::sensor(&local_44,pVar8,P);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)__return_storage_ptr__,iVar5,&local_44
                    );
        }
        else {
          (iVar5._M_current)->sense = local_44.sense;
          (iVar5._M_current)->location = local_44.location;
          ppsVar1 = &(__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
      }
      bVar7 = Room::has_wumpus((Room *)local_38);
      if (bVar7) {
        sensor::sensor(&local_44,pVar8,W);
        iVar5._M_current =
             (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<sensor,std::allocator<sensor>>::_M_realloc_insert<sensor_const&>
                    ((vector<sensor,std::allocator<sensor>> *)__return_storage_ptr__,iVar5,&local_44
                    );
        }
        else {
          (iVar5._M_current)->sense = local_44.sense;
          (iVar5._M_current)->location = local_44.location;
          ppsVar1 = &(__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppsVar1 = *ppsVar1 + 1;
        }
        (this->p).wumpus = true;
      }
      if (this->is_wumpus_dead != true) {
        return __return_storage_ptr__;
      }
      this_00 = (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
          super__Vector_impl_data._M_finish != this_00) {
        pVar8 = sensor::get_Location(this_00);
        sensor::sensor(&local_44,pVar8,scream);
        (this->p).scream = true;
        return __return_storage_ptr__;
      }
      goto LAB_001072cc;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001072cc:
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  psVar6 = (__return_storage_ptr__->super__Vector_base<sensor,_std::allocator<sensor>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar6 != (pointer)0x0) {
    operator_delete(psVar6);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

vector<sensor> PlayGround::execute()
{
    pair<int, int> location = playableworld.agent_location;
    if (action.move)
    {
        location = playableworld.move_forward();
    }
    if (action.shoot)
    {
        playableworld.shoot();
    }
    kill_agent();

    Room room = playableworld.world.boxes.at(location.second - 1).at(location.first - 1);
    vector<sensor> perception;
    if (room.get_breeze())
    {
        Type type = Type::B;
        sensor s = sensor(location, type);
        perception.push_back(s);
        p.breeze=true;
    }
    if (room.get_stench())
    {
        Type type = Type::S;
        sensor s = sensor(location, type);
        perception.push_back(s);
        p.stench=true;
    }
    if (room.get_glitter())
    {
        Type type = Type::G;
        sensor s = sensor(location, type);
        perception.push_back(s);
        is_gold_found = true;
        p.glitter=true;
    }
    if (room.has_pit())
    {
        Type type = Type::P;
        sensor s = sensor(location, type);
        perception.push_back(s);

    }
    if (room.has_wumpus())
    {
        Type type = Type::W;
        sensor s = sensor(location, type);
        perception.push_back(s);
        p.wumpus=true;
    }
    if (is_wumpus_dead)
    {
        Type t = Type::scream;
        sensor s = sensor(perception.at(0).get_Location(), t);
        p.scream=true;
    }
    return perception;
}